

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

char * nullcDebugGetVmAddressLocation(uint instruction,uint full)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint moduleIndex;
  uint uVar4;
  byte *sourceLocation;
  long lVar5;
  long lVar6;
  char *pcVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  uint column;
  long local_290;
  long local_280;
  uint local_274;
  OutputContext local_270;
  
  nullcDebugGetVmAddressLocation::buffer.pos = 0;
  local_270.outputBuf = local_270.outputBufDef;
  local_270.outputBufSize = 0x100;
  local_270.outputBufPos = 0;
  local_270.tempBuf = local_270.tempBufDef;
  local_270.tempBufSize = 0x100;
  local_270.openStream = OutputContext::FileOpen;
  local_270.closeStream = OutputContext::FileClose;
  local_270.stream = &nullcDebugGetVmAddressLocation::buffer;
  local_270.writeStream = anon_unknown.dwarf_4ff1::BufferWriteStream;
  if (NULLC::linker == 0) {
    pbVar8 = (byte *)0x0;
    lVar6 = 0;
    uVar4 = 0;
    local_280 = 0;
    uVar11 = 0;
    local_290 = 0;
  }
  else {
    uVar4 = *(uint *)(NULLC::linker + 0x24c);
    lVar6 = *(long *)(NULLC::linker + 0x240);
    local_280 = *(long *)(NULLC::linker + 0x290);
    pbVar8 = *(byte **)(NULLC::linker + 0x2a0);
    uVar11 = *(uint *)(NULLC::linker + 0x28c);
    local_290 = *(long *)(NULLC::linker + 0x280);
  }
  sourceLocation = (byte *)nullcDebugGetInstructionSourceLocation(instruction);
  moduleIndex = nullcDebugGetSourceLocationModuleIndex((char *)sourceLocation);
  if (full != 0) {
    if (moduleIndex < uVar11) {
      OutputContext::Printf
                (&local_270,"{%s} ",
                 (ulong)*(uint *)(local_290 + 4 + (ulong)moduleIndex * 0x1c) + local_280);
    }
    else {
      OutputContext::Printf(&local_270,"{root} ");
    }
  }
  if (uVar4 != 0) {
    lVar12 = 0;
LAB_0010df78:
    iVar3 = *(int *)(lVar6 + 4 + lVar12);
    if (((int)instruction < iVar3) || (iVar3 + *(int *)(lVar6 + 8 + lVar12) <= (int)instruction))
    goto LAB_0010df8c;
    OutputContext::Printf(&local_270,"%s(",(ulong)*(uint *)(lVar6 + lVar12) + local_280);
    if (NULLC::linker == 0) {
      local_290 = 0;
      lVar10 = 0;
    }
    else {
      local_290 = *(long *)(NULLC::linker + 0x200);
      lVar10 = *(long *)(NULLC::linker + 0x270);
    }
    uVar4 = *(uint *)(lVar6 + 0x54 + lVar12);
    if (uVar4 != 0) {
      uVar11 = 0;
      do {
        lVar5 = (ulong)(*(int *)(lVar6 + 0x50 + lVar12) + uVar11) * 0x1c;
        if (*(char *)(lVar10 + lVar5) == '\0') {
          lVar5 = lVar5 + lVar10;
          pcVar7 = ", ";
          if (uVar11 == 0) {
            pcVar7 = "";
          }
          OutputContext::Printf
                    (&local_270,"%s%s %s",pcVar7,
                     (ulong)*(uint *)(local_290 + (ulong)*(uint *)(lVar5 + 4) * 0x50) + local_280,
                     (ulong)*(uint *)(lVar5 + 0x18) + local_280);
          uVar4 = *(uint *)(lVar6 + 0x54 + lVar12);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < uVar4);
    }
    OutputContext::Print(&local_270,")",1);
    goto LAB_0010e098;
  }
LAB_0010df98:
  OutputContext::Print(&local_270,"nullcGlobal()",0xd);
LAB_0010e098:
  if (sourceLocation == (byte *)0x0) {
    if (local_270.outputBufPos != 0) {
      (*local_270.writeStream)(local_270.stream,local_270.outputBuf,local_270.outputBufPos);
    }
  }
  else {
    local_274 = 0;
    uVar4 = nullcDebugGetSourceLocationLineAndColumn((char *)sourceLocation,moduleIndex,&local_274);
    if (full == 0) {
      OutputContext::Printf(&local_270," Line %d",(ulong)(uVar4 + 1));
    }
    else {
      do {
        pbVar9 = pbVar8;
        if (sourceLocation == pbVar8) break;
        pbVar1 = sourceLocation + -1;
        pbVar9 = sourceLocation;
        sourceLocation = sourceLocation + -1;
      } while (*pbVar1 != 10);
      for (; (bVar2 = *pbVar9, bVar2 == 9 || (bVar2 == 0x20)); pbVar9 = pbVar9 + 1) {
      }
      lVar6 = 0;
      while ((0xd < bVar2 || ((0x2401U >> (bVar2 & 0x1f) & 1) == 0))) {
        bVar2 = pbVar9[lVar6 + 1];
        lVar6 = lVar6 + 1;
      }
      OutputContext::Printf(&local_270," Line %d at \'%.*s\'",(ulong)(uVar4 + 1),lVar6,pbVar9);
    }
    if (local_270.outputBufPos != 0) {
      (*local_270.writeStream)(local_270.stream,local_270.outputBuf,local_270.outputBufPos);
    }
  }
  local_270._264_8_ = local_270._264_8_ & 0xffffffff;
  local_270.stream = (void *)0x0;
  nullcDebugGetVmAddressLocation::buffer.buf[nullcDebugGetVmAddressLocation::buffer.pos] = '\0';
  OutputContext::~OutputContext(&local_270);
  return nullcDebugGetVmAddressLocation::buffer.buf;
LAB_0010df8c:
  lVar12 = lVar12 + 0x94;
  if ((ulong)uVar4 * 0x94 - lVar12 == 0) goto LAB_0010df98;
  goto LAB_0010df78;
}

Assistant:

const char* nullcDebugGetVmAddressLocation(unsigned instruction, unsigned full)
{
	using namespace NULLC;

	static OutputBuffer buffer;

	// Reset position
	buffer.pos = 0;

	OutputContext output;

	output.stream = &buffer;
	output.writeStream = BufferWriteStream;

	unsigned functionCount = 0;
	ExternFuncInfo *functions = nullcDebugFunctionInfo(&functionCount);

	char *symbols = nullcDebugSymbols(NULL);

	char *fullSource = nullcDebugSource();

	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char *sourceLocation = nullcDebugGetInstructionSourceLocation(instruction);

	unsigned moduleIndex = nullcDebugGetSourceLocationModuleIndex(sourceLocation);

	if(full)
	{
		if(moduleIndex < moduleCount)
			output.Printf("{%s} ", symbols + modules[moduleIndex].nameOffset);
		else
			output.Printf("{root} ");
	}

	ExternFuncInfo *targetFunction = nullcDebugConvertAddressToFunction(instruction, functions, functionCount);

	if(targetFunction)
	{
		output.Printf("%s(", symbols + targetFunction->offsetToName);

		unsigned exTypesSize = 0;
		ExternTypeInfo *exTypes = nullcDebugTypeInfo(&exTypesSize);

		unsigned exLocalsSize = 0;
		ExternLocalInfo *exLocals = nullcDebugLocalInfo(&exLocalsSize);

		for(unsigned i = 0; i < targetFunction->paramCount; i++)
		{
			ExternLocalInfo &lInfo = exLocals[targetFunction->offsetToFirstLocal + i];

			if(lInfo.paramType != ExternLocalInfo::PARAMETER)
				continue;

			output.Printf("%s%s %s", i != 0 ? ", " : "", symbols + exTypes[lInfo.type].offsetToName, symbols + lInfo.offsetToName);
		}

		output.Print(")");
	}
	else
	{
		output.Print("nullcGlobal()");
	}

	// Stop if source location is missing
	if(!sourceLocation)
	{
		output.Flush();
		output.stream = NULL;
		buffer.buf[buffer.pos] = 0;

		return buffer.buf;
	}

	const char *codeStart = sourceLocation;

	unsigned column = 0;
	unsigned line = nullcDebugGetSourceLocationLineAndColumn(codeStart, moduleIndex, column);

	if(full)
	{
		// Find beginning of the line
		while(codeStart != fullSource && *(codeStart - 1) != '\n')
			codeStart--;

		// Skip whitespace
		while(*codeStart == ' ' || *codeStart == '\t')
			codeStart++;

		const char *codeEnd = codeStart;

		// Find ending of the line
		while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
			codeEnd++;

		int codeLength = int(codeEnd - codeStart);
		output.Printf(" Line %d at '%.*s'", line + 1, codeLength, codeStart);
	}
	else
	{
		output.Printf(" Line %d", line + 1);
	}

	output.Flush();
	output.stream = NULL;
	buffer.buf[buffer.pos] = 0;

	return buffer.buf;
}